

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

bool __thiscall
capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage::tryExpandUsage
          (DataLocationUsage *this,Group *group,DataLocation *location,uint desiredUsage,
          bool newHoles)

{
  bool bVar1;
  Fault f;
  
  if ((location->lgSize < desiredUsage) &&
     (bVar1 = Union::DataLocation::tryExpandTo(location,group->parent,desiredUsage), !bVar1)) {
    return false;
  }
  if (newHoles) {
    HoleSet<unsigned_char>::addHolesAtEnd(&this->holes,this->lgSizeUsed,'\x01',(uchar)desiredUsage);
  }
  else {
    bVar1 = shouldDetectIssue344();
    if (bVar1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[180]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                 ,0x1ae,FAILED,(char *)0x0,
                 "\"Bad news: Cap\'n Proto 0.5.x and previous contained a bug which would cause this schema to be compiled incorrectly. Please see: https://github.com/sandstorm-io/capnproto/issues/344\""
                 ,(char (*) [180])
                  "Bad news: Cap\'n Proto 0.5.x and previous contained a bug which would cause this schema to be compiled incorrectly. Please see: https://github.com/sandstorm-io/capnproto/issues/344"
                );
      kj::_::Debug::Fault::fatal(&f);
    }
  }
  this->lgSizeUsed = (uchar)desiredUsage;
  return true;
}

Assistant:

bool tryExpandUsage(Group& group, Union::DataLocation& location, uint desiredUsage,
                          bool newHoles) {
        if (desiredUsage > location.lgSize) {
          // Need to expand the underlying slot.
          if (!location.tryExpandTo(group.parent, desiredUsage)) {
            return false;
          }
        }

        // Underlying slot is big enough, so expand our size and update holes.
        if (newHoles) {
          holes.addHolesAtEnd(lgSizeUsed, 1, desiredUsage);
        } else if (shouldDetectIssue344()) {
          // Unfortunately, Cap'n Proto 0.5.x and below would always call addHolesAtEnd(), which
          // was the wrong thing to do when called from tryExpand(), which itself is only called
          // in cases involving unions nested in other unions. The bug could lead to multiple
          // fields in a group incorrectly being assigned overlapping offsets. Although the bug
          // is now fixed by adding the `newHoles` parameter, this silently breaks
          // backwards-compatibilty with affected schemas. Therefore, for now, we throw an
          // exception to alert developers of the problem.
          //
          // TODO(cleanup): Once sufficient time has elapsed, remove this assert.
          KJ_FAIL_ASSERT("Bad news: Cap'n Proto 0.5.x and previous contained a bug which would cause this schema to be compiled incorrectly. Please see: https://github.com/sandstorm-io/capnproto/issues/344");
        }
        lgSizeUsed = desiredUsage;
        return true;
      }